

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

NameSyntax * __thiscall
slang::ast::Compilation::tryParseName(Compilation *this,string_view name,Diagnostics *localDiags)

{
  NameSyntax *pNVar1;
  Parser parser;
  Preprocessor preprocessor;
  SourceManager *sourceMan;
  char *in_stack_fffffffffffff7e8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff7f0;
  Bag *options;
  Preprocessor *preprocessor_00;
  Parser *this_00;
  Preprocessor *in_stack_fffffffffffff880;
  string_view in_stack_fffffffffffff888;
  string_view in_stack_fffffffffffff898;
  Preprocessor *pPStack_400;
  Bag local_3f8 [6];
  Bag *in_stack_fffffffffffffd28;
  Diagnostics *in_stack_fffffffffffffd30;
  BumpAllocator *in_stack_fffffffffffffd38;
  SourceManager *in_stack_fffffffffffffd40;
  Preprocessor *in_stack_fffffffffffffd48;
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
  in_stack_fffffffffffffec0;
  
  slang::syntax::SyntaxTree::getDefaultSourceManager();
  local_3f8[0].items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .size_ctrl.ml = 0;
  local_3f8[0].items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .size_ctrl.size = 0;
  local_3f8[0].items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_3f8[0].items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_3f8[0].items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_size_index = 0;
  local_3f8[0].items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_size_mask = 0;
  options = local_3f8;
  Bag::Bag((Bag *)0x7ceb58);
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x7ceb65);
  parsing::Preprocessor::Preprocessor
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffec0);
  Bag::~Bag((Bag *)0x7ceba3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  parsing::Preprocessor::pushSource
            (in_stack_fffffffffffff880,in_stack_fffffffffffff898,in_stack_fffffffffffff888);
  preprocessor_00 = (Preprocessor *)0x0;
  this_00 = (Parser *)0x0;
  Bag::Bag((Bag *)0x7cec12);
  parsing::Parser::Parser(this_00,preprocessor_00,options);
  Bag::~Bag((Bag *)0x7cec37);
  pNVar1 = parsing::Parser::parseName((Parser *)pPStack_400);
  parsing::Parser::~Parser((Parser *)pPStack_400);
  parsing::Preprocessor::~Preprocessor(pPStack_400);
  return pNVar1;
}

Assistant:

const NameSyntax& Compilation::tryParseName(std::string_view name, Diagnostics& localDiags) {
    SourceManager& sourceMan = SyntaxTree::getDefaultSourceManager();
    Preprocessor preprocessor(sourceMan, *this, localDiags);
    preprocessor.pushSource(name);

    Parser parser(preprocessor);
    return parser.parseName();
}